

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FailoverStrategy.cpp
# Opt level: O1

void __thiscall
xmrig::FailoverStrategy::onClose(FailoverStrategy *this,IClient *client,int failures)

{
  size_t sVar1;
  pointer ppIVar2;
  int iVar3;
  int iVar4;
  
  if (failures != -1) {
    iVar4 = this->m_active;
    iVar3 = (*client->_vptr_IClient[0xc])(client);
    if (iVar4 == iVar3) {
      this->m_active = -1;
      (*this->m_listener->_vptr_IStrategyListener[5])(this->m_listener,this);
    }
    sVar1 = this->m_index;
    if ((sVar1 != 0) || (this->m_retries <= failures)) {
      iVar4 = (*client->_vptr_IClient[0xc])(client);
      if (sVar1 == (long)iVar4) {
        sVar1 = this->m_index;
        ppIVar2 = (this->m_pools).
                  super__Vector_base<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (1 < ((long)(this->m_pools).
                       super__Vector_base<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)ppIVar2 >> 3) - sVar1) {
          this->m_index = sVar1 + 1;
          (*ppIVar2[sVar1 + 1]->_vptr_IClient[0x11])();
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void xmrig::FailoverStrategy::onClose(IClient *client, int failures)
{
    if (failures == -1) {
        return;
    }

    if (m_active == client->id()) {
        m_active = -1;
        m_listener->onPause(this);
    }

    if (m_index == 0 && failures < m_retries) {
        return;
    }

    if (m_index == static_cast<size_t>(client->id()) && (m_pools.size() - m_index) > 1) {
        m_pools[++m_index]->connect();
    }
}